

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O3

void __thiscall
kratos::FSM::generate_state_transition
          (FSM *this,Enum *enum_def,EnumVar *current_state,EnumVar *next_state,
          unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *state_name_mapping)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  element_type *this_01;
  element_type *this_02;
  pointer ppVar5;
  element_type *this_03;
  element_type *peVar6;
  element_type *peVar7;
  _Base_ptr p_Var8;
  const_iterator cVar9;
  _Base_ptr p_Var10;
  InternalException *this_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __k;
  enable_shared_from_this<kratos::Var> *__r;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar11 [8];
  string_view format_str;
  format_args args;
  undefined1 local_158 [8];
  shared_ptr<kratos::CombinationalStmtBlock> state_comb;
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> states;
  undefined1 local_120 [8];
  shared_ptr<kratos::SwitchStmt> case_state_comb;
  undefined1 auStack_108 [8];
  shared_ptr<kratos::FunctionStmtBlock> func_def;
  shared_ptr<kratos::IfStmt> top_if;
  undefined1 auStack_e0 [8];
  vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
  transitions;
  undefined8 uStack_a8;
  shared_ptr<kratos::FunctionCallStmt> func_stmt;
  shared_ptr<kratos::IfStmt> if_;
  undefined1 auStack_78 [8];
  shared_ptr<kratos::AssignStmt> stmt_1;
  shared_ptr<kratos::AssignStmt> stmt;
  undefined1 auStack_48 [8];
  shared_ptr<kratos::IfStmt> new_if;
  
  peVar7 = stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Generator::combinational((Generator *)local_158);
  auStack_108 = (undefined1  [8])0x0;
  func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  if (this->moore_ == false) {
    get_func_def((FSM *)&stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    auStack_108 = (undefined1  [8])
                  stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
    this_02 = func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)peVar7;
    if (this_02 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
    }
  }
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             &stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(current_state->super_Var).super_enable_shared_from_this<kratos::Var>);
  std::__shared_ptr<kratos::SwitchStmt,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<kratos::SwitchStmt>,std::shared_ptr<kratos::Var>>
            ((__shared_ptr<kratos::SwitchStmt,(__gnu_cxx::_Lock_policy)2> *)local_120,
             (_Sp_alloc_shared_tag<std::allocator<kratos::SwitchStmt>_>)
             &state_comb.
              super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             (shared_ptr<kratos::Var> *)
             &stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  get_all_child_states
            ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)
             &state_comb.
              super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this,false);
  if (state_comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this_00 = &stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ;
    __k = state_comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
    do {
      cVar9 = std::
              _Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&state_name_mapping->_M_h,(key_type *)__k._M_pi);
      if (cVar9.
          super__Node_iterator_base<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
      }
      func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::
      vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
      ::vector((vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                *)auStack_e0,&((key_type)(__k._M_pi)->_vptr__Sp_counted_base)->transitions_);
      ppVar5 = transitions.
               super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)transitions.
                super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start - (long)auStack_e0 == 0x10) {
        transitions.
        super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)(*(long *)auStack_e0 == 0);
      }
      else {
        transitions.
        super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
      if (auStack_e0 !=
          (undefined1  [8])
          transitions.
          super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        bVar4 = false;
        bVar3 = false;
        auVar11 = auStack_e0;
        case_state_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)cVar9.
                    super__Node_iterator_base<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                    ._M_cur + 0x10);
        if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             __k._M_pi;
        do {
          if ((Var *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar11)->
                     _vptr__Sp_counted_base == (Var *)0x0) {
            if ((long)transitions.
                      super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)auStack_e0 == 0x10) {
              in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                       )*(anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                          *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar11)->_M_use_count
              ;
              get_next_state_stmt((FSM *)this_00,(Enum *)this,(EnumVar *)enum_def,
                                  (FSMState *)next_state,
                                  (FSMState *)
                                  (if_.
                                   super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base,
                                  (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_R9.values_);
              auVar11 = local_120;
              Enum::get_enum((Enum *)auStack_78,(string *)enum_def);
              auStack_48 = auStack_78;
              new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              auStack_78 = (undefined1  [8])0x0;
              stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              uStack_a8 = stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
              func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)
                       stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  pvVar1 = &((stmt.
                              super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                  *(int *)&(pvVar1->
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_start =
                       *(int *)&(pvVar1->
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1;
                  UNLOCK();
                }
                else {
                  pvVar1 = &((stmt.
                              super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                  *(int *)&(pvVar1->
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_start =
                       *(int *)&(pvVar1->
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1;
                }
              }
              SwitchStmt::add_switch_case
                        ((SwitchStmt *)auVar11,(shared_ptr<kratos::Const> *)auStack_48,
                         (shared_ptr<kratos::Stmt> *)&stack0xffffffffffffff58);
              if (func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           func_stmt.
                           super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
              }
              if (new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
              }
              if (stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
              }
              if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
              }
              break;
            }
            states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 *(pointer *)
                  &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar11)->_M_use_count;
            bVar3 = bVar4;
            if (!bVar4) {
              bVar3 = true;
              bVar4 = bVar3;
            }
          }
          else {
            __r = &((Var *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar11)->
                           _vptr__Sp_counted_base)->super_enable_shared_from_this<kratos::Var>;
            if (func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<kratos::Var,void>
                        ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)auStack_48,
                         (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)__r);
              std::__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<kratos::IfStmt>,std::shared_ptr<kratos::Var>>
                        ((__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2> *)this_00,
                         (allocator<kratos::IfStmt> *)auStack_78,
                         (shared_ptr<kratos::Var> *)auStack_48);
              func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount = stmt_1.
                            super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount;
              peVar6 = if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              if (peVar6 != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6);
              }
              if (new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
              }
              in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                       )*(anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                          *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar11)->_M_use_count
              ;
              get_next_state_stmt((FSM *)auStack_48,(Enum *)this,(EnumVar *)enum_def,
                                  (FSMState *)next_state,
                                  (FSMState *)
                                  (if_.
                                   super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base,
                                  (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_R9.values_);
              peVar6 = new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_48;
              stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              if (new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  pvVar1 = &((new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                  *(int *)&(pvVar1->
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_start =
                       *(int *)&(pvVar1->
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1;
                  UNLOCK();
                }
                else {
                  pvVar1 = &((new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                  *(int *)&(pvVar1->
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_start =
                       *(int *)&(pvVar1->
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1;
                }
              }
              IfStmt::add_then_stmt
                        ((IfStmt *)
                         func_stmt.
                         super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi,(shared_ptr<kratos::Stmt> *)this_00);
              if (peVar6 != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6);
              }
              auStack_78 = (undefined1  [8])0x0;
              stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              if (this->moore_ == false) {
                get_func_call_stmt((shared_ptr<kratos::FunctionStmtBlock> *)auStack_108,
                                   *(FSMState **)
                                    &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar11)->
                                     _M_use_count,(shared_ptr<kratos::FunctionCallStmt> *)auStack_78
                                  );
                peVar7 = stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
                stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_78;
                stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
                if (stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    != (element_type *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    pvVar1 = &((stmt_1.
                                super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                    *(int *)&(pvVar1->
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             )._M_impl.super__Vector_impl_data._M_start =
                         *(int *)&(pvVar1->
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1;
                    UNLOCK();
                  }
                  else {
                    pvVar1 = &((stmt_1.
                                super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                    *(int *)&(pvVar1->
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             )._M_impl.super__Vector_impl_data._M_start =
                         *(int *)&(pvVar1->
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1;
                  }
                }
                IfStmt::add_then_stmt
                          ((IfStmt *)
                           func_stmt.
                           super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi,(shared_ptr<kratos::Stmt> *)this_00);
                if (peVar7 != (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar7);
                }
              }
              func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount = func_stmt.
                            super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&top_if,
                         (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&if_);
              if ((this->generator_->debug == true) && (auStack_78 != (undefined1  [8])0x0)) {
                add_debug_info((FSMState *)
                               (if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base,
                               (shared_ptr<kratos::FunctionCallStmt> *)auStack_78);
                stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)anon_var_dwarf_479630;
                stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)
                     CONCAT44(stmt.
                              super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr._4_4_,0x103);
                std::
                vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                ::emplace_back<std::pair<char_const*,int>>
                          ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                            *)((long)auStack_78 + 8),(pair<const_char_*,_int> *)this_00);
              }
            }
            else {
              std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<kratos::Var,void>
                        ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)this_00,
                         (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)__r);
              std::__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<kratos::IfStmt>,std::shared_ptr<kratos::Var>>
                        ((__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2> *)auStack_48,
                         (allocator<kratos::IfStmt> *)auStack_78,(shared_ptr<kratos::Var> *)this_00)
              ;
              if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
              }
              in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                       )*(anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                          *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar11)->_M_use_count
              ;
              get_next_state_stmt((FSM *)auStack_78,(Enum *)this,(EnumVar *)enum_def,
                                  (FSMState *)next_state,
                                  (FSMState *)
                                  (if_.
                                   super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base,
                                  (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_R9.values_);
              peVar7 = stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              uStack_a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x0;
              stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_78;
              if (stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  != (element_type *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  pvVar1 = &((stmt_1.
                              super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                  *(int *)&(pvVar1->
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_start =
                       *(int *)&(pvVar1->
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1;
                  UNLOCK();
                }
                else {
                  pvVar1 = &((stmt_1.
                              super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                  *(int *)&(pvVar1->
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_start =
                       *(int *)&(pvVar1->
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1;
                }
              }
              IfStmt::add_then_stmt((IfStmt *)auStack_48,(shared_ptr<kratos::Stmt> *)this_00);
              if (peVar7 != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar7);
              }
              if (this->moore_ == false) {
                get_func_call_stmt((shared_ptr<kratos::FunctionStmtBlock> *)auStack_108,
                                   *(FSMState **)
                                    &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar11)->
                                     _M_use_count,
                                   (shared_ptr<kratos::FunctionCallStmt> *)&stack0xffffffffffffff58)
                ;
                this_03 = func_stmt.
                          super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr;
                stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_a8;
                if (func_stmt.
                    super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    != (element_type *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    pvVar1 = &((func_stmt.
                                super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                    *(int *)&(pvVar1->
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             )._M_impl.super__Vector_impl_data._M_start =
                         *(int *)&(pvVar1->
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1;
                    UNLOCK();
                  }
                  else {
                    pvVar1 = &((func_stmt.
                                super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                    *(int *)&(pvVar1->
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             )._M_impl.super__Vector_impl_data._M_start =
                         *(int *)&(pvVar1->
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1;
                  }
                }
                IfStmt::add_then_stmt((IfStmt *)auStack_48,(shared_ptr<kratos::Stmt> *)this_00);
                if (this_03 != (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03);
                }
              }
              if ((this->generator_->debug == true) &&
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_a8 !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                add_debug_info((FSMState *)
                               (if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base,
                               (shared_ptr<kratos::FunctionCallStmt> *)&stack0xffffffffffffff58);
                stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)anon_var_dwarf_479630;
                std::
                vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                ::emplace_back<std::pair<char_const*,int>>
                          ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                            *)(uStack_a8 + 8),(pair<const_char_*,_int> *)this_00);
              }
              peVar6 = new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_48;
              stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              if (new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  pvVar1 = &((new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                  *(int *)&(pvVar1->
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_start =
                       *(int *)&(pvVar1->
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1;
                  UNLOCK();
                }
                else {
                  pvVar1 = &((new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                  *(int *)&(pvVar1->
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_start =
                       *(int *)&(pvVar1->
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1;
                }
              }
              IfStmt::add_else_stmt
                        ((IfStmt *)
                         func_stmt.
                         super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi,(shared_ptr<kratos::Stmt> *)this_00);
              if (peVar6 != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6);
              }
              func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_48;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&if_,
                         (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&new_if);
              if (func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           func_stmt.
                           super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
              }
            }
            if (stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
            if (new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
          }
          auVar11 = (undefined1  [8])((long)auVar11 + 0x10);
        } while (auVar11 != (undefined1  [8])ppVar5);
        __k._M_pi = if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
        if (bVar3) {
          in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                   )states.
                    super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          get_next_state_stmt((FSM *)auStack_48,(Enum *)this,(EnumVar *)enum_def,
                              (FSMState *)next_state,
                              (FSMState *)
                              (if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base,
                              (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)states.
                                 super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
          peVar6 = new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_48;
          stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              pvVar1 = &((new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
              *(int *)&(pvVar1->
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start =
                   *(int *)&(pvVar1->
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1;
              UNLOCK();
            }
            else {
              pvVar1 = &((new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
              *(int *)&(pvVar1->
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start =
                   *(int *)&(pvVar1->
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          IfStmt::add_else_stmt
                    ((IfStmt *)
                     func_stmt.
                     super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi,(shared_ptr<kratos::Stmt> *)this_00);
          if (peVar6 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6);
          }
          auStack_78 = (undefined1  [8])0x0;
          stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          if (this->moore_ == false) {
            get_func_call_stmt((shared_ptr<kratos::FunctionStmtBlock> *)auStack_108,
                               (FSMState *)
                               states.
                               super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (shared_ptr<kratos::FunctionCallStmt> *)auStack_78);
            peVar7 = stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_78;
            stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                pvVar1 = &((stmt_1.
                            super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                *(int *)&(pvVar1->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start =
                     *(int *)&(pvVar1->
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1;
                UNLOCK();
              }
              else {
                pvVar1 = &((stmt_1.
                            super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                *(int *)&(pvVar1->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start =
                     *(int *)&(pvVar1->
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1;
              }
            }
            IfStmt::add_then_stmt
                      ((IfStmt *)
                       func_stmt.
                       super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi,(shared_ptr<kratos::Stmt> *)this_00);
            if (peVar7 != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar7);
            }
            if ((this->generator_->debug == true) && (auStack_78 != (undefined1  [8])0x0)) {
              add_debug_info((FSMState *)(__k._M_pi)->_vptr__Sp_counted_base,
                             (shared_ptr<kratos::FunctionCallStmt> *)auStack_78);
              stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)anon_var_dwarf_479630;
              stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
                   (undefined4)((ulong)peVar7 >> 0x20);
              stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   CONCAT44(stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr._4_4_,0x103);
              std::
              vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
              ::emplace_back<std::pair<char_const*,int>>
                        ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                          *)((long)auStack_78 + 8),(pair<const_char_*,_int> *)this_00);
            }
          }
          if (stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
          }
          if (new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
          }
        }
      }
      auVar11 = local_120;
      if (transitions.
          super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ == '\0') {
        if (func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          this_04 = (InternalException *)__cxa_allocate_exception(0x10);
          auStack_48 = (undefined1  [8])
                       (((key_type)(__k._M_pi)->_vptr__Sp_counted_base)->name_)._M_dataplus._M_p;
          new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               (((key_type)(__k._M_pi)->_vptr__Sp_counted_base)->name_)._M_string_length;
          format_str.size_ = 0xd;
          format_str.data_ = (char *)0x31;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)auStack_48;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)
                     &stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(detail *)"Unable to find any state transition for state {0}",
                     format_str,args);
          InternalException::InternalException
                    (this_04,(string *)
                             &stmt_1.
                              super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
          __cxa_throw(this_04,&InternalException::typeinfo,std::runtime_error::~runtime_error);
        }
        Enum::get_enum((Enum *)auStack_48,(string *)enum_def);
        peVar6 = new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_48;
        stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auStack_48 = (undefined1  [8])0x0;
        new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        auStack_78 = (undefined1  [8])
                     func_def.
                     super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
        stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            pvVar1 = &((top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->super_Stmt).super_IRNode.fn_name_ln;
            *(int *)&(pvVar1->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(pvVar1->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
            UNLOCK();
          }
          else {
            pvVar1 = &((top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->super_Stmt).super_IRNode.fn_name_ln;
            *(int *)&(pvVar1->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(pvVar1->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        SwitchStmt::add_switch_case
                  ((SwitchStmt *)auVar11,(shared_ptr<kratos::Const> *)this_00,
                   (shared_ptr<kratos::Stmt> *)auStack_78);
        if (stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        }
        if (peVar6 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6);
        }
        if (new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      if (auStack_e0 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_e0,
                        (long)transitions.
                              super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_e0);
      }
      if (top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if (if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      __k._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&(__k._M_pi)->_M_use_count;
    } while (__k._M_pi !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
             _M_impl.super__Vector_impl_data._M_start);
  }
  auVar11 = local_158;
  Var::assign((Var *)auStack_e0,&next_state->super_Var,(AssignmentType)current_state);
  ppVar5 = transitions.
           super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_e0;
  auStack_e0 = (undefined1  [8])0x0;
  transitions.
  super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  StmtBlock::add_stmt((StmtBlock *)auVar11,
                      (shared_ptr<kratos::Stmt> *)
                      &stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  if (ppVar5 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppVar5);
  }
  if (transitions.
      super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               transitions.
               super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(_Base_ptr *)((long)local_120 + 0xf0) != (_Base_ptr)0x0) {
    p_Var8 = *(_Base_ptr *)((long)local_120 + 0xf0);
    do {
      p_Var10 = p_Var8;
      p_Var8 = p_Var10->_M_left;
    } while (p_Var10->_M_left != (_Base_ptr)0x0);
    if ((p_Var10 != (_Base_ptr)((long)local_120 + 0xe8U)) && (*(long *)(p_Var10 + 1) == 0))
    goto LAB_001ca616;
  }
  uVar2 = *(size_t *)((long)local_120 + 0x108) - 1;
  if ((*(size_t *)((long)local_120 + 0x108) ^ uVar2) <= uVar2) {
    stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Var::assign((Var *)auStack_48,&next_state->super_Var,(AssignmentType)current_state);
    auStack_e0 = auStack_48;
    transitions.
    super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    auStack_48 = (undefined1  [8])0x0;
    new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    SwitchStmt::add_switch_case
              ((SwitchStmt *)local_120,
               (shared_ptr<kratos::Const> *)
               &stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(shared_ptr<kratos::Stmt> *)auStack_e0);
    if (transitions.
        super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 transitions.
                 super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
    if (new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
LAB_001ca616:
  this_01 = case_state_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (case_state_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pvVar1 = &((case_state_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
      *(int *)&(pvVar1->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar1->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      pvVar1 = &((case_state_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
      *(int *)&(pvVar1->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar1->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  StmtBlock::add_stmt((StmtBlock *)local_158,
                      (shared_ptr<kratos::Stmt> *)
                      &stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  if (this_01 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  if (state_comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(state_comb.
                    super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,
                    (long)states.
                          super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)state_comb.
                          super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi);
  }
  if (case_state_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               case_state_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  if (func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  if (state_comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               state_comb.
               super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
  }
  return;
}

Assistant:

void FSM::generate_state_transition(
    Enum& enum_def, EnumVar& current_state, EnumVar& next_state,
    const std::unordered_map<FSMState*, std::string>& state_name_mapping) {
    auto state_comb = generator_->combinational();

    std::shared_ptr<FunctionStmtBlock> func_def = nullptr;
    if (!moore_) func_def = get_func_def();
    auto case_state_comb = std::make_shared<SwitchStmt>(current_state.shared_from_this());
    auto states = get_all_child_states(false);

    auto add_debug_info_to_stmt = [this](std::shared_ptr<FunctionCallStmt>& func_stmt,
                                         const FSMState* state) {
        if (generator_->debug) {
            if (func_stmt) {
                add_debug_info(state, func_stmt);
                func_stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
            }
        }
    };
    for (auto const& state : states) {
        auto const& state_name = state_name_mapping.at(state);
        // a list of if statements
        std::shared_ptr<IfStmt> if_ = nullptr;
        std::shared_ptr<IfStmt> top_if = nullptr;
        auto transitions = state->transitions();
        // slide through condition
        bool has_slide_through = false;
        if (transitions.size() == 1 && transitions[0].first == nullptr) {
            has_slide_through = true;
        }
        std::optional<std::pair<Var *, FSMState *>> default_state;
        for (auto const& [cond, next_fsm_state] : transitions) {
            if (!cond && (transitions.size() == 1)) {
                // direct transition
                auto stmt = get_next_state_stmt(enum_def, next_state, state, next_fsm_state,
                                                state_name_mapping);
                case_state_comb->add_switch_case(enum_def.get_enum(state_name), stmt);
                break;
            } else if (!cond) {
                // we have a default case here
                default_state= std::make_pair(cond, next_fsm_state);
                continue;
            }

            if (!if_) {
                if_ = std::make_shared<IfStmt>(cond->shared_from_this());
                auto stmt = get_next_state_stmt(enum_def, next_state, state, next_fsm_state,
                                                state_name_mapping);
                if_->add_then_stmt(stmt);
                // mealy machine need to add extra state transition outputs
                std::shared_ptr<FunctionCallStmt> func_stmt = nullptr;
                if (!moore_) {
                    get_func_call_stmt(func_def, next_fsm_state, func_stmt);
                    if_->add_then_stmt(func_stmt);
                }
                top_if = if_;
                add_debug_info_to_stmt(func_stmt, state);
            } else {
                auto new_if = std::make_shared<IfStmt>(cond->shared_from_this());
                auto stmt = get_next_state_stmt(enum_def, next_state, state, next_fsm_state,
                                                state_name_mapping);
                // mealy machine need to add extra state transition outputs
                std::shared_ptr<FunctionCallStmt> func_stmt = nullptr;
                new_if->add_then_stmt(stmt);
                if (!moore_) {
                    get_func_call_stmt(func_def, next_fsm_state, func_stmt);
                    new_if->add_then_stmt(func_stmt);
                }
                add_debug_info_to_stmt(func_stmt, state);
                if_->add_else_stmt(new_if);
                if_ = new_if;
            }
        }

        if (default_state) {
            auto* next_fsm_state = default_state->second;
            auto stmt = get_next_state_stmt(enum_def, next_state, state, next_fsm_state,
                                            state_name_mapping);
            if_->add_else_stmt(stmt);
            // mealy machine need to add extra state transition outputs
            std::shared_ptr<FunctionCallStmt> func_stmt = nullptr;
            if (!moore_) {
                get_func_call_stmt(func_def, next_fsm_state, func_stmt);
                if_->add_then_stmt(func_stmt);
            }
            add_debug_info_to_stmt(func_stmt, state);
        }

        if (!has_slide_through) {
            if (!top_if)
                throw InternalException(
                    ::format("Unable to find any state transition for state {0}", state->name()));
            case_state_comb->add_switch_case(enum_def.get_enum(state_name), top_if);
        }
    }

    // prevent latch generation
    state_comb->add_stmt(next_state.assign(current_state, AssignmentType::Blocking));

    // also default case
    if (case_state_comb->body().find(nullptr) == case_state_comb->body().end() &&
        !is_2_power(case_state_comb->body().size())) {
        case_state_comb->add_switch_case(
            nullptr, next_state.assign(current_state, AssignmentType::Blocking));
    }

    // add it to the state_comb
    state_comb->add_stmt(case_state_comb);
}